

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

QMetaMethodBuilder __thiscall
QMetaObjectBuilder::addMethod(QMetaObjectBuilder *this,QByteArray *signature,QByteArray *returnType)

{
  QMetaObjectBuilderPrivate *pQVar1;
  pointer pQVar2;
  pointer pQVar3;
  long in_FS_OFFSET;
  QMetaMethodBuilder QVar4;
  QMetaMethodBuilderPrivate local_98;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->d;
  pQVar2 = (pQVar1->methods).
           super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pQVar3 = (pQVar1->methods).
           super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  QMetaMethodBuilderPrivate::QMetaMethodBuilderPrivate
            (&local_98,Method,signature,returnType,Public,0);
  std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::
  emplace_back<QMetaMethodBuilderPrivate>(&pQVar1->methods,&local_98);
  if (&(local_98.tag.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.tag.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.tag.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.tag.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.tag.d.d)->super_QArrayData,1,0x10);
    }
  }
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_98.parameterNames.d);
  if (&(local_98.returnType.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.returnType.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.returnType.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.returnType.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_98.returnType.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_98.signature.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.signature.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.signature.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.signature.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_98.signature.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QVar4._index = (int)((ulong)((long)pQVar3 - (long)pQVar2) >> 3) * -0x3b13b13b;
    QVar4._mobj = this;
    QVar4._12_4_ = 0;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QMetaMethodBuilder QMetaObjectBuilder::addMethod(const QByteArray &signature,
                                                 const QByteArray &returnType)
{
    int index = int(d->methods.size());
    d->methods.push_back(QMetaMethodBuilderPrivate(QMetaMethod::Method, signature, returnType));
    return QMetaMethodBuilder(this, index);
}